

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

vector<wallet::COutput,_std::allocator<wallet::COutput>_> * __thiscall
wallet::CoinsResult::All
          (vector<wallet::COutput,_std::allocator<wallet::COutput>_> *__return_storage_ptr__,
          CoinsResult *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::reserve
            (__return_storage_ptr__,(this->coins)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var2 = (this->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->coins)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    std::vector<wallet::COutput,std::allocator<wallet::COutput>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<wallet::COutput_const*,std::vector<wallet::COutput,std::allocator<wallet::COutput>>>>
              ((vector<wallet::COutput,std::allocator<wallet::COutput>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>)._M_impl.
               super__Vector_impl_data._M_finish,p_Var2[1]._M_parent,p_Var2[1]._M_left);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<COutput> CoinsResult::All() const
{
    std::vector<COutput> all;
    all.reserve(coins.size());
    for (const auto& it : coins) {
        all.insert(all.end(), it.second.begin(), it.second.end());
    }
    return all;
}